

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_capabilities.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseCapabilities(Parser *this)

{
  bool bVar1;
  TokenType TVar2;
  Token *pTVar3;
  Parser *in_RSI;
  bool local_a9;
  undefined1 local_90 [28];
  undefined4 local_74;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> local_70;
  undefined1 local_68 [24];
  undefined1 local_50 [8];
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ensures;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  requires;
  bool isconstant;
  bool isinline;
  bool isunused;
  Parser *this_local;
  
  requires.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  requires.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  requires.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            *)&ensures.
               super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            *)local_50);
  do {
    pTVar3 = Lexer::getCurrentToken(in_RSI->lexer);
    bVar1 = Token::operator==(pTVar3,TOK_ENSURE);
    if (bVar1) {
LAB_0012fa3a:
      pTVar3 = Lexer::getCurrentToken(in_RSI->lexer);
      local_a9 = Token::operator!=(pTVar3,TOK_EOF);
    }
    else {
      pTVar3 = Lexer::getCurrentToken(in_RSI->lexer);
      bVar1 = Token::operator==(pTVar3,TOK_DIRECTIVE);
      local_a9 = false;
      if (bVar1) goto LAB_0012fa3a;
    }
    if (local_a9 == false) {
      pTVar3 = Lexer::getCurrentToken(in_RSI->lexer);
      TVar2 = Token::getType(pTVar3);
      if (((TVar2 == TOK_KW_FN) || (TVar2 == TOK_KW_CLASS)) ||
         (TVar2 == TOK_KW_TRAIT || TVar2 == TOK_KW_TYPE)) {
        std::
        make_unique<pfederc::Capabilities,bool&,bool&,bool&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                  ((bool *)&local_70,
                   (bool *)((long)&requires.
                                   super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                   (bool *)((long)&requires.
                                   super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),
                   (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)((long)&requires.
                              super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 5),
                   (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)&ensures.
                       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        parsePrimary(this,(unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                           *)in_RSI);
        std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::
        ~unique_ptr(&local_70);
      }
      else {
        local_90._6_2_ = 2;
        local_90._0_4_ = 0x29;
        pTVar3 = Lexer::getCurrentToken(in_RSI->lexer);
        Token::getPosition(pTVar3);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_90 + 8),(SyntaxErrorCode *)(local_90 + 6),(Position *)local_90);
        generateError((Parser *)(local_90 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)in_RSI);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_90 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_90 + 8));
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
      }
      local_74 = 1;
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 *)local_50);
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 *)&ensures.
                    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
    }
    pTVar3 = Lexer::getCurrentToken(in_RSI->lexer);
    bVar1 = Token::operator==(pTVar3,TOK_ENSURE);
    if (bVar1) {
      parseCapabilityEnsure
                (in_RSI,(vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                         *)&ensures.
                            super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  *)local_50);
    }
    else {
      parseCapabilityDirective
                (in_RSI,(bool *)((long)&requires.
                                        super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                 (bool *)((long)&requires.
                                 super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),
                 (bool *)((long)&requires.
                                 super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
    }
    bVar1 = expect(in_RSI,TOK_EOL);
    if (!bVar1) {
      local_68._6_2_ = 2;
      local_68._0_4_ = 0xf;
      pTVar3 = Lexer::getCurrentToken(in_RSI->lexer);
      Token::getPosition(pTVar3);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_68 + 8),(SyntaxErrorCode *)(local_68 + 6),(Position *)local_68);
      generateError((Parser *)(local_68 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_68 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_68 + 8));
      skipToEol(in_RSI);
    }
    while( true ) {
      pTVar3 = Lexer::getCurrentToken(in_RSI->lexer);
      bVar1 = Token::operator==(pTVar3,TOK_EOL);
      if (!bVar1) break;
      Lexer::next(in_RSI->lexer);
    }
  } while( true );
}

Assistant:

std::unique_ptr<Expr> Parser::parseCapabilities() noexcept {
  bool isunused = false, isinline = false, isconstant = false;
  std::vector<std::unique_ptr<Expr>> requires;
  std::vector<std::unique_ptr<Expr>> ensures;

  while ((*lexer.getCurrentToken() == TokenType::TOK_ENSURE
      || *lexer.getCurrentToken() == TokenType::TOK_DIRECTIVE)
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {

    if (*lexer.getCurrentToken() == TokenType::TOK_ENSURE)
      parseCapabilityEnsure(requires, ensures);
    else
      parseCapabilityDirective(isunused, isinline, isconstant);

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      skipToEol();
    }

    // skip new lines
    while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
      lexer.next();
  }

  switch (lexer.getCurrentToken()->getType()) {
  case TokenType::TOK_KW_CLASS:
  case TokenType::TOK_KW_FN:
  case TokenType::TOK_KW_TRAIT:
  case TokenType::TOK_KW_TYPE:
    return parsePrimary(std::make_unique<Capabilities>(
          isunused, isinline, isconstant,
          std::move(requires), std::move(ensures)));
  default:
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_FOLLOWUP,
          lexer.getCurrentToken()->getPosition()));
    return nullptr;
  }
}